

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

Expression
dynet::detail::
f<dynet::Concatenate,std::vector<dynet::Expression,std::allocator<dynet::Expression>>,unsigned_int>
          (vector<dynet::Expression,_std::allocator<dynet::Expression>_> *xs,uint *arg1)

{
  bool bVar1;
  VariableIndex VVar2;
  pointer pEVar3;
  Expression *this;
  reference pvVar4;
  int iVar5;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *in_RDI;
  const_iterator xi;
  int i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> xis;
  ComputationGraph *pg;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *in_stack_ffffffffffffff68;
  __normal_iterator<const_dynet::Expression_*,_std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>
  *in_stack_ffffffffffffff70;
  ComputationGraph *pCVar6;
  VariableIndex in_stack_ffffffffffffff7c;
  undefined1 *__n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff90;
  __normal_iterator<const_dynet::Expression_*,_std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>
  local_68;
  int iVar7;
  undefined4 in_stack_ffffffffffffffa4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffa8;
  ComputationGraph *in_stack_ffffffffffffffb0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  __normal_iterator<const_dynet::Expression_*,_std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>
  local_30;
  ComputationGraph *local_28;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *local_18;
  Expression local_10;
  
  local_18 = in_RDI;
  local_30._M_current =
       (Expression *)
       std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::begin
                 (in_stack_ffffffffffffff68);
  pEVar3 = __gnu_cxx::
           __normal_iterator<const_dynet::Expression_*,_std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>
           ::operator->(&local_30);
  local_28 = pEVar3->pg;
  this = (Expression *)
         std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::size(local_18);
  __n = &stack0xffffffffffffffb7;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x9289f9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffff90,(size_type)__n,(allocator_type *)this);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x928a19);
  iVar7 = 0;
  local_68._M_current =
       (Expression *)
       std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::begin
                 (in_stack_ffffffffffffff68);
  while( true ) {
    std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::end
              (in_stack_ffffffffffffff68);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff70,
                       (__normal_iterator<const_dynet::Expression_*,_std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) break;
    pEVar3 = __gnu_cxx::
             __normal_iterator<const_dynet::Expression_*,_std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>
             ::operator->(&local_68);
    in_stack_ffffffffffffff7c = pEVar3->i;
    iVar5 = iVar7 + 1;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_48,(long)iVar7);
    *pvVar4 = in_stack_ffffffffffffff7c;
    __gnu_cxx::
    __normal_iterator<const_dynet::Expression_*,_std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>
    ::operator++(&local_68);
    iVar7 = iVar5;
  }
  pCVar6 = local_28;
  VVar2 = ComputationGraph::
          add_function<dynet::Concatenate,std::vector<unsigned_int,std::allocator<unsigned_int>>,unsigned_int_const&>
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                     (uint *)CONCAT44(in_stack_ffffffffffffffa4,iVar7));
  Expression::Expression
            (this,(ComputationGraph *)CONCAT44(in_stack_ffffffffffffff7c,VVar2),
             (VariableIndex)((ulong)pCVar6 >> 0x20));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
  return local_10;
}

Assistant:

Expression f(const T& xs, const T1& arg1) {
  ComputationGraph *pg = xs.begin()->pg;
  std::vector<VariableIndex> xis(xs.size());
  int i = 0;
  for (auto xi = xs.begin(); xi != xs.end(); ++xi) xis[i++] = xi->i;
  return Expression(pg, pg->add_function<F>(xis, arg1));
}